

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

CompoundExp * __thiscall CompoundExp::toString_abi_cxx11_(CompoundExp *this)

{
  long in_RSI;
  string local_108 [48];
  string local_d8 [32];
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  CompoundExp *this_local;
  
  this_local = this;
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x18))();
  std::operator+((char)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28);
  std::operator+(local_98,(char)local_b8);
  std::operator+(local_78,local_98);
  std::operator+(local_58,(char)local_78);
  (**(code **)(**(long **)(in_RSI + 0x30) + 0x18))(local_108);
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  return this;
}

Assistant:

string CompoundExp::toString() {
   return '(' + lhs->toString() + ' ' + op + ' ' + rhs->toString() + ')';
}